

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

void rw::d3d8::render(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *pGVar1;
  _func_void_ObjPipeline_ptr_Atomic_ptr *UNRECOVERED_JUMPTABLE;
  
  pGVar1 = atomic->geometry;
  if (pGVar1->instData == (InstanceDataHeader *)0x0) {
    (*(rwpipe->impl).instance)(rwpipe,atomic);
  }
  UNRECOVERED_JUMPTABLE = rwpipe[1].impl.instance;
  if (UNRECOVERED_JUMPTABLE != (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)((ObjPipeline *)atomic,(Atomic *)pGVar1->instData);
    return;
  }
  return;
}

Assistant:

static void
render(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE
	if(geo->instData == nil)
		pipe->instance(atomic);
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D8);
	if(pipe->renderCB)
		pipe->renderCB(atomic, (InstanceDataHeader*)geo->instData);
}